

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorTable.hpp
# Opt level: O0

int64_t primesum::FactorTable<unsigned_short>::next_multiple
                  (int64_t prime,int64_t low,int64_t *index)

{
  long lVar1;
  uint64_t *puVar2;
  int64_t iVar3;
  uint64_t *in_RDX;
  long in_RSI;
  long in_RDI;
  int64_t multiple;
  int64_t i;
  int64_t quotient;
  long local_38;
  int64_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  uint64_t *local_18;
  long local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = ceil_div<long,long>(in_RSI,in_RDI);
  puVar2 = local_18;
  local_30 = AbstractFactorTable::get_index(local_20);
  puVar2 = (uint64_t *)std::max<long>((long *)puVar2,&local_30);
  local_28 = *puVar2;
  local_38 = 0;
  while (lVar1 = local_8, local_38 <= local_10) {
    iVar3 = AbstractFactorTable::get_number(local_28);
    local_28 = local_28 + 1;
    local_38 = lVar1 * iVar3;
  }
  *local_18 = local_28;
  return local_38;
}

Assistant:

static int64_t next_multiple(int64_t prime,
                               int64_t low,
                               int64_t* index)
  {
    int64_t quotient = ceil_div(low, prime);
    int64_t i = std::max(*index, get_index(quotient));
    int64_t multiple = 0;

    for (; multiple <= low; i++)
      multiple = prime * get_number(i);

    *index = i;
    return multiple;
  }